

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collision_PDU.cpp
# Opt level: O3

void __thiscall
KDIS::PDU::Collision_PDU::Decode(Collision_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  KUINT16 KVar1;
  KException *this_00;
  int iVar2;
  undefined7 in_register_00000011;
  KString local_40;
  
  KVar1 = KDataStream::GetBufferSize(stream);
  iVar2 = 0xc;
  if ((int)CONCAT71(in_register_00000011,ignoreHeader) == 0) {
    iVar2 = 0;
  }
  if (0x3b < iVar2 + (uint)KVar1) {
    Header7::Decode(&this->super_Header,stream,ignoreHeader);
    (*(this->m_IssuingEntityID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase[3])
              (&this->m_IssuingEntityID,stream);
    (*(this->m_CollidingEntityID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase
      [3])(&this->m_CollidingEntityID,stream);
    (*(this->m_EventID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase[3])
              (&this->m_EventID,stream);
    KDataStream::Read(stream,&this->m_ui8CollisionType);
    KDataStream::Read(stream,&this->m_ui8Padding);
    (*(this->m_Velocity).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_Velocity,stream);
    KDataStream::Read<float>(stream,(float *)&this->m_f32Mass);
    (*(this->m_Location).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_Location,stream);
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Decode","");
  KException::KException(this_00,&local_40,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void Collision_PDU::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < COLLISION_PDU_SIZE  )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    Header::Decode( stream, ignoreHeader );

    stream >> KDIS_STREAM m_IssuingEntityID
           >> KDIS_STREAM m_CollidingEntityID
           >> KDIS_STREAM m_EventID
           >> m_ui8CollisionType
           >> m_ui8Padding
           >> KDIS_STREAM m_Velocity
           >> m_f32Mass
           >> KDIS_STREAM m_Location;
}